

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.cpp
# Opt level: O2

RegressionTest * embree::getRegressionTest(size_t index)

{
  RegressionTest *pRVar1;
  
  get_regression_tests();
  if (index < (ulong)((long)get_regression_tests::regression_tests.
                            super__Vector_base<embree::RegressionTest_*,_std::allocator<embree::RegressionTest_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)get_regression_tests::regression_tests.
                            super__Vector_base<embree::RegressionTest_*,_std::allocator<embree::RegressionTest_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    get_regression_tests();
    pRVar1 = get_regression_tests::regression_tests.
             super__Vector_base<embree::RegressionTest_*,_std::allocator<embree::RegressionTest_*>_>
             ._M_impl.super__Vector_impl_data._M_start[index];
  }
  else {
    pRVar1 = (RegressionTest *)0x0;
  }
  return pRVar1;
}

Assistant:

RegressionTest* getRegressionTest(size_t index)
  {
    if (index >= get_regression_tests().size())
      return nullptr;
    
    return get_regression_tests()[index];
  }